

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O2

void predict_or_learn_with_confidence<true,false>
               (confidence *param_1,single_learner *base,example *ec)

{
  float fVar1;
  
  fVar1 = LEARNER::learner<char,_example>::sensitivity(base,ec,0);
  LEARNER::learner<char,_example>::learn(base,ec,0);
  ec->confidence = ABS((ec->pred).scalar) / fVar1;
  return;
}

Assistant:

void predict_or_learn_with_confidence(confidence& /* c */, single_learner& base, example& ec)
{
  float threshold = 0.f;
  float sensitivity = 0.f;
  if (!is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.confidence = fabsf(ec.pred.scalar - threshold) / sensitivity;
}